

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

button_state * button_state_create(xcb_connection_t *connection)

{
  byte keycodes_per_modifier;
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  undefined4 uVar4;
  int iVar5;
  button_state *pbVar6;
  toggle_modifiers *__ptr;
  xcb_key_symbols_t *symbols;
  toggle_modifiers *__ptr_00;
  xcb_keycode_t *modifiers;
  uint16_t *puVar7;
  ushort uVar8;
  long lVar9;
  uint8_t modifier_count;
  long lVar10;
  
  pbVar6 = (button_state *)malloc(0x28);
  if (pbVar6 == (button_state *)0x0) {
    return (button_state *)0x0;
  }
  __ptr = (toggle_modifiers *)malloc(0x10);
  if (__ptr != (toggle_modifiers *)0x0) {
    symbols = (xcb_key_symbols_t *)xcb_key_symbols_alloc(connection);
    if (symbols != (xcb_key_symbols_t *)0x0) {
      uVar4 = xcb_get_modifier_mapping(connection);
      __ptr_00 = (toggle_modifiers *)xcb_get_modifier_mapping_reply(connection,uVar4,0);
      if ((__ptr_00 == (toggle_modifiers *)0x0) ||
         (*(char *)((long)&__ptr_00->num_lock + 1) == '\0')) {
        free(__ptr);
        xcb_key_symbols_free(symbols);
        goto LAB_0010480b;
      }
      modifiers = (xcb_keycode_t *)xcb_get_modifier_mapping_keycodes(__ptr_00);
      if (modifiers != (xcb_keycode_t *)0x0) {
        iVar5 = xcb_get_modifier_mapping_keycodes_length(__ptr_00);
        keycodes_per_modifier = *(byte *)((long)&__ptr_00->num_lock + 1);
        lVar9 = (long)iVar5 / (long)(int)(uint)keycodes_per_modifier;
        if (0xff < (uint)lVar9) {
          __assert_fail("modifier_count >= 0 && modifier_count <= UINT8_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/button.c"
                        ,0xa6,
                        "struct toggle_modifiers *resolve_toggle_modifiers(xcb_connection_t *)");
        }
        modifier_count = (uint8_t)lVar9;
        uVar1 = modifier_mask_from_keysym
                          (symbols,modifiers,modifier_count,keycodes_per_modifier,0xff7f);
        __ptr->num_lock = uVar1;
        uVar2 = modifier_mask_from_keysym
                          (symbols,modifiers,modifier_count,
                           *(uint8_t *)((long)&__ptr_00->num_lock + 1),0xffe5);
        __ptr->caps_lock = uVar2;
        uVar3 = modifier_mask_from_keysym
                          (symbols,modifiers,modifier_count,
                           *(uint8_t *)((long)&__ptr_00->num_lock + 1),0xff14);
        __ptr->scroll_lock = uVar3;
        if (uVar2 == 0) {
          __ptr->caps_lock = 2;
          uVar2 = 2;
        }
        puVar7 = (uint16_t *)malloc(0x10);
        if (puVar7 != (uint16_t *)0x0) {
          if (uVar1 == 0) {
            if (uVar3 != 0) {
              *puVar7 = uVar2 | uVar3;
              lVar9 = 2;
              lVar10 = lVar9;
              goto LAB_0010485d;
            }
            lVar9 = 0;
LAB_00104865:
            puVar7[lVar9] = uVar2;
          }
          else {
            uVar8 = uVar2 | uVar1;
            if (uVar3 != 0) {
              *puVar7 = uVar8 | uVar3;
              puVar7[1] = uVar8;
              puVar7[2] = uVar1 | uVar3;
              puVar7[3] = uVar2 | uVar3;
              puVar7[4] = uVar1;
              lVar9 = 6;
              lVar10 = 10;
LAB_0010485d:
              *(uint16_t *)((long)puVar7 + lVar10) = uVar2;
              uVar2 = uVar3;
              goto LAB_00104865;
            }
            *puVar7 = uVar8;
            puVar7[1] = uVar1;
            puVar7[2] = uVar2;
            lVar9 = 2;
          }
          puVar7[lVar9 + 1] = 0;
          __ptr->masks = puVar7;
          xcb_key_symbols_free(symbols);
          free(__ptr_00);
          pbVar6->modifiers = __ptr;
          goto LAB_0010482c;
        }
      }
      free(__ptr);
      xcb_key_symbols_free(symbols);
      __ptr = __ptr_00;
    }
    free(__ptr);
  }
LAB_0010480b:
  pbVar6->modifiers = (toggle_modifiers *)0x0;
  internal_logger(natwm_logger,LEVEL_WARNING,
                  "Failed to resolve toggleable modifier keys! This may cause issues");
LAB_0010482c:
  pbVar6->grabbed_client = (client *)0x0;
  pbVar6->resize_helper = 0;
  return pbVar6;
}

Assistant:

struct button_state *button_state_create(xcb_connection_t *connection)
{
        struct button_state *state = malloc(sizeof(struct button_state));

        if (state == NULL) {
                return NULL;
        }

        state->modifiers = resolve_toggle_modifiers(connection);

        if (state->modifiers == NULL) {
                LOG_WARNING(natwm_logger,
                            "Failed to resolve toggleable modifier keys! This may cause issues");
        }

        state->grabbed_client = NULL;
        state->resize_helper = XCB_NONE;

        return state;
}